

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
FindNextProperty_BigPropertyIndex
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          ScriptContext *scriptContext,int *index,JavascriptString **propertyStringName,
          PropertyId *propertyId,PropertyAttributes *attributes,Type *type,
          DynamicType *typeToEnumerate,EnumeratorFlags flags,DynamicObject *instance,
          PropertyValueInfo *info)

{
  byte bVar1;
  DynamicTypeHandler *pDVar2;
  JavascriptString *key;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  PropertyId propertyId_00;
  undefined4 *puVar7;
  ScriptContext *pSVar8;
  SimpleDictionaryPropertyDescriptor<int> *pSVar9;
  JavascriptString **ppJVar10;
  PropertyString *pPVar11;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar12;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  undefined4 *local_58;
  EnumeratorFlags *local_50;
  ScriptContext *local_48;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *local_40;
  SimpleDictionaryPropertyDescriptor<int> local_38;
  SimpleDictionaryPropertyDescriptor<int> descriptor;
  
  local_48 = scriptContext;
  local_40 = this;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f0,"(propertyStringName)","propertyStringName");
    if (!bVar4) goto LAB_00de31bd;
    *puVar7 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f1,"(propertyId)","propertyId");
    if (!bVar4) goto LAB_00de31bd;
    *puVar7 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f2,"(type)","type");
    if (!bVar4) goto LAB_00de31bd;
    *puVar7 = 0;
  }
  if (typeToEnumerate == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f3,"(typeToEnumerate)","typeToEnumerate");
    if (!bVar4) {
LAB_00de31bd:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  local_50 = attributes;
  if ((DynamicType *)type == typeToEnumerate) {
    iVar5 = *index;
    pBVar12 = (local_40->propertyMap).ptr;
    if (pBVar12->count - pBVar12->freeCount <= iVar5) {
      return 0;
    }
    do {
      pSVar9 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(pBVar12,iVar5);
      bVar1 = pSVar9->Attributes;
      if (((bVar1 & 0x18) == 0) && (((flags & EnumNonEnumerable) != None || ((bVar1 & 1) != 0)))) {
        ppJVar10 = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetKeyAt((local_40->propertyMap).ptr,*index);
        pSVar8 = local_48;
        key = *ppJVar10;
        if (local_50 != (byte *)0x0) {
          *local_50 = bVar1;
        }
        propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_48,key);
        *propertyId = propertyId_00;
        pPVar11 = ScriptContext::GetPropertyString(pSVar8,propertyId_00);
        *propertyStringName = &pPVar11->super_JavascriptString;
        return 1;
      }
      iVar5 = *index + 1;
      *index = iVar5;
      pBVar12 = (local_40->propertyMap).ptr;
    } while (iVar5 < pBVar12->count - pBVar12->freeCount);
  }
  else {
    pDVar2 = (typeToEnumerate->typeHandler).ptr;
    propertyRecord = (PropertyRecord *)(ulong)flags;
    iVar5 = (*pDVar2->_vptr_DynamicTypeHandler[0xb])
                      (pDVar2,local_48,index,propertyStringName,propertyId,attributes,
                       typeToEnumerate,typeToEnumerate,propertyRecord,instance,info);
    if (iVar5 == 0) {
      return 0;
    }
    local_58 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      local_38.Attributes = '\a';
      local_38._0_1_ = (local_38._0_1_ & 0xf0) + 1;
      local_38.propertyIndex = -1;
      if (*propertyId == -1) {
        if (*propertyStringName != (JavascriptString *)0x0) {
          bVar4 = JsUtil::
                  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                  ::TryGetValue<Js::JavascriptString*>
                            ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                              *)(local_40->propertyMap).ptr,propertyStringName,&local_38);
          goto LAB_00de30b6;
        }
      }
      else {
        pSVar8 = Js::Type::GetScriptContext(type);
        local_68 = ScriptContext::GetPropertyName(pSVar8,*propertyId);
        if (((flags & EnumSymbols) == None) && (local_68->isSymbol == true)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = local_58;
          *local_58 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x32c,
                                      "(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol())"
                                      ,
                                      "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols"
                                     );
          if (!bVar4) goto LAB_00de31bd;
          *puVar7 = 0;
        }
        pBVar12 = (local_40->propertyMap).ptr;
        uVar6 = JsUtil::
                BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                ::FindEntryWithKey<Js::PropertyRecord_const*>
                          ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                            *)pBVar12,&local_68);
        bVar4 = -1 < (int)uVar6;
        attributes = local_50;
        if (bVar4) {
          local_38 = *(SimpleDictionaryPropertyDescriptor<int> *)((pBVar12->entries).ptr + uVar6);
        }
LAB_00de30b6:
        if (((bVar4 != false) && (((ulong)local_38 & 0x1800) == 0)) &&
           (((local_38.Attributes | flags) & EnumNonEnumerable) != None)) {
          if (attributes != (EnumeratorFlags *)0x0) {
            *attributes = local_38.Attributes;
          }
          return 1;
        }
      }
      *index = *index + 1;
      iVar5 = (*pDVar2->_vptr_DynamicTypeHandler[0xb])
                        (pDVar2,local_48,index,propertyStringName,propertyId,attributes,
                         typeToEnumerate,typeToEnumerate,propertyRecord,instance,info);
    } while (iVar5 != 0);
  }
  return 0;
}

Assistant:

inline BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty_BigPropertyIndex(ScriptContext* scriptContext, TPropertyIndex& index,
        JavascriptString** propertyStringName, PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);
        Assert(typeToEnumerate);

        if(type == typeToEnumerate)
        {
            for( ; index < propertyMap->Count(); ++index )
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(index));
                if( !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (descriptor.Attributes & PropertyEnumerable)))
                {
                    auto key = propertyMap->GetKeyAt(index);

                    // Skip this property if it is a symbol and we are not including symbol properties
                    if (!(flags & EnumeratorFlags::EnumSymbols) && TMapKey_IsSymbol(key, scriptContext))
                    {
                        continue;
                    }

                    if (attributes != nullptr)
                    {
                        *attributes = descriptor.Attributes;
                    }

                    *propertyId = TMapKey_GetPropertyId(scriptContext, key);
                    *propertyStringName = scriptContext->GetPropertyString(*propertyId);

                    return TRUE;
                }
            }

            return FALSE;
        }

        // Need to enumerate a different type than the current one. This is because type snapshot enumerate is enabled and the
        // object's type changed since enumeration began, so need to enumerate properties of the initial type.
        DynamicTypeHandler *const typeHandlerToEnumerate = typeToEnumerate->GetTypeHandler();
        for(
            ;
            typeHandlerToEnumerate->FindNextProperty(
                scriptContext,
                index,
                propertyStringName,
                propertyId,
                attributes,
                typeToEnumerate,
                typeToEnumerate,
                flags,
                instance,
                info);
            ++index)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
            bool hasValue = false;
            if (*propertyId != Constants::NoProperty)
            {
                PropertyRecord const* propertyRecord = type->GetScriptContext()->GetPropertyName(*propertyId);

                AssertMsg(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol(),
                    "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols");

                hasValue = propertyMap->TryGetValue(propertyRecord, &descriptor);
            }
            else if (*propertyStringName != nullptr)
            {
                hasValue = propertyMap->TryGetValue(*propertyStringName, &descriptor);
            }
            if (hasValue &&
                !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) &&
                (!!(flags & EnumeratorFlags::EnumNonEnumerable) || descriptor.Attributes & PropertyEnumerable))
            {
                if (attributes != nullptr)
                {
                    *attributes = descriptor.Attributes;
                }

                return TRUE;
            }
        }

        return FALSE;
    }